

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O3

void strescape(char *s,char c)

{
  bool bVar1;
  char *pcVar2;
  char cVar3;
  char *in;
  
  cVar3 = *s;
  if (cVar3 != '\0') {
    pcVar2 = s + 1;
    bVar1 = false;
    do {
      bVar1 = (bool)(cVar3 == c & (bVar1 ^ 1U));
      if (!bVar1) {
        *s = cVar3;
        s = s + 1;
      }
      cVar3 = *pcVar2;
      pcVar2 = pcVar2 + 1;
    } while (cVar3 != '\0');
  }
  *s = '\0';
  return;
}

Assistant:

void strescape(char *s, const char c) {
	char *in = s;
	char *out = s;
	bool escapenext = false;
	while (*in) {
		if (*in != c || escapenext) {
			*out = *in;
			out++;
			escapenext = false;
		} else if (*in == c) {
			escapenext = true;
		}
		in++;
	}
	*out = 0;
}